

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olf.h
# Opt level: O2

void __thiscall OLF<4U>::OLF(OLF<4U> *this,int num,int _HIT)

{
  Abstract<4U>::Abstract(&this->super_Abstract<4U>);
  (this->super_Abstract<4U>)._vptr_Abstract = (_func_int **)&PTR_Init_00111c40;
  (this->mp)._M_h._M_buckets = &(this->mp)._M_h._M_single_bucket;
  (this->mp)._M_h._M_bucket_count = 1;
  (this->mp)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->mp)._M_h._M_element_count = 0;
  (this->mp)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->mp)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->mp)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->sp)._M_h._M_buckets = &(this->sp)._M_h._M_single_bucket;
  (this->sp)._M_h._M_bucket_count = 1;
  (this->sp)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->sp)._M_h._M_element_count = 0;
  (this->sp)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->sp)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->sp)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->super_Abstract<4U>).HIT = _HIT;
  (this->super_Abstract<4U>).pr = 0.0;
  (this->super_Abstract<4U>).cr = 0.0;
  (this->super_Abstract<4U>).aae = 0.0;
  (this->super_Abstract<4U>).are = 0.0;
  std::__cxx11::string::assign((char *)&(this->super_Abstract<4U>).name);
  std::__cxx11::string::assign((char *)&(this->super_Abstract<4U>).sep);
  this->epsilon = (double)(num / 100000) * 0.0011;
  return;
}

Assistant:

OLF(int num, int _HIT) {
		this->HIT = _HIT;
		this->aae = this->are = this->pr = this->cr = 0;
		this->name = "OLF";
		this->sep = "\t\t\t";
		epsilon = num / 100000 * 0.0011;
	}